

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::JsonReporter::assertionEnded(JsonReporter *this,AssertionStats *assertionStats)

{
  bool bVar1;
  size_type __n;
  void *__buf;
  AssertionResult *in_RSI;
  StringRef SVar2;
  SourceLineInfo *in_stack_00000178;
  JsonObjectWriter *in_stack_00000180;
  JsonObjectWriter assertionObject;
  undefined7 in_stack_fffffffffffffc48;
  undefined1 in_stack_fffffffffffffc4f;
  AssertionResult *this_00;
  JsonArrayWriter *in_stack_fffffffffffffc58;
  size_t local_3a0;
  JsonValueWriter local_398;
  SourceLineInfo local_200;
  StringRef local_1f0;
  StringRef local_1d0;
  JsonValueWriter local_1c0;
  AssertionResult *local_10;
  
  local_10 = in_RSI;
  std::
  stack<Catch::JsonArrayWriter,_std::deque<Catch::JsonArrayWriter,_std::allocator<Catch::JsonArrayWriter>_>_>
  ::top((stack<Catch::JsonArrayWriter,_std::deque<Catch::JsonArrayWriter,_std::allocator<Catch::JsonArrayWriter>_>_>
         *)0x1a4fbb);
  this_00 = (AssertionResult *)&stack0xffffffffffffffd8;
  JsonArrayWriter::writeObject(in_stack_fffffffffffffc58);
  local_1d0 = operator____sr((char *)this_00,
                             CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48));
  __n = local_1d0.m_size;
  JsonObjectWriter::write
            ((JsonObjectWriter *)&local_1c0,(int)this_00,local_1d0.m_start,local_1d0.m_size);
  local_1f0 = operator____sr((char *)this_00,
                             CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48));
  JsonValueWriter::write(&local_1c0,(int)local_1f0.m_start,(void *)local_1f0.m_size,__n);
  JsonValueWriter::~JsonValueWriter((JsonValueWriter *)0x1a5062);
  local_200 = AssertionResult::getSourceInfo(local_10);
  anon_unknown_26::writeSourceInfo(in_stack_00000180,in_stack_00000178);
  SVar2 = operator____sr((char *)this_00,
                         CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48));
  local_3a0 = SVar2.m_size;
  JsonObjectWriter::write
            ((JsonObjectWriter *)&local_398,(int)&stack0xffffffffffffffd8,SVar2.m_start,local_3a0);
  bVar1 = AssertionResult::isOk(this_00);
  JsonValueWriter::write(&local_398,(uint)bVar1,__buf,local_3a0);
  JsonValueWriter::~JsonValueWriter((JsonValueWriter *)0x1a5102);
  JsonObjectWriter::~JsonObjectWriter((JsonObjectWriter *)this_00);
  return;
}

Assistant:

void JsonReporter::assertionEnded( AssertionStats const& assertionStats ) {
        // TODO: There is lot of different things to handle here, but
        //       we can fill it in later, after we show that the basic
        //       outline and streaming reporter impl works well enough.
        //if ( !m_config->includeSuccessfulResults()
        //    && assertionStats.assertionResult.isOk() ) {
        //    return;
        //}
        assert( isInside( Writer::Array ) );
        auto assertionObject = m_arrayWriters.top().writeObject();

        assertionObject.write( "kind"_sr ).write( "assertion"_sr );
        writeSourceInfo( assertionObject,
                         assertionStats.assertionResult.getSourceInfo() );
        assertionObject.write( "status"_sr )
            .write( assertionStats.assertionResult.isOk() );
        // TODO: handling of result.
        // TODO: messages
        // TODO: totals?
    }